

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

bool R_ClipWallSegment(int first,int last,bool solid)

{
  ulong uVar1;
  cliprange_t *pcVar2;
  long lVar3;
  bool bVar4;
  cliprange_t *pcVar5;
  int iVar6;
  cliprange_t *pcVar7;
  short sVar8;
  cliprange_t *pcVar9;
  
  pcVar7 = (cliprange_t *)&DAT_0080796c;
  do {
    pcVar2 = pcVar7;
    pcVar7 = pcVar2 + 1;
  } while (pcVar2[1].last < first);
  iVar6 = (int)pcVar7->first;
  bVar4 = first < iVar6;
  if (first < iVar6) {
    sVar8 = (short)first;
    if (last <= iVar6) {
      R_StoreWallRange(first,last);
      if (!solid || ((byte)fake3D & 7) != 0) {
        return true;
      }
      if (pcVar7->first == last) {
        pcVar7->first = sVar8;
        return true;
      }
      pcVar2 = newend;
      newend = newend + 1;
      for (; pcVar7 != pcVar2; pcVar2 = pcVar2 + -1) {
        *pcVar2 = pcVar2[-1];
      }
      pcVar2->first = sVar8;
      pcVar2->last = (short)last;
      return true;
    }
    R_StoreWallRange(first,iVar6);
    if ((solid) && (((byte)fake3D & 7) == 0)) {
      pcVar7->first = sVar8;
    }
  }
  pcVar5 = pcVar7;
  if (pcVar2[1].last < last) {
    do {
      if (last < pcVar5[1].first) {
        R_StoreWallRange((int)pcVar5->last,last);
        pcVar9 = pcVar5;
        iVar6 = last;
        break;
      }
      pcVar9 = pcVar5 + 1;
      R_StoreWallRange((int)pcVar5->last,(int)pcVar5[1].first);
      iVar6 = (int)pcVar5[1].last;
      pcVar5 = pcVar9;
    } while (iVar6 < last);
    bVar4 = true;
    if ((solid && ((byte)fake3D & 7) == 0) && (pcVar2[1].last = (short)iVar6, pcVar7 != pcVar9)) {
      lVar3 = 0;
      for (uVar1 = (ulong)((long)newend - (long)pcVar9) >> 2; 0 < (int)uVar1;
          uVar1 = (ulong)((int)uVar1 - 1)) {
        *(undefined4 *)((long)&pcVar2[2].first + lVar3) =
             *(undefined4 *)((long)&pcVar9[1].first + lVar3);
        lVar3 = lVar3 + 4;
      }
      newend = (cliprange_t *)((long)&pcVar7[1].first + lVar3);
    }
  }
  return bVar4;
}

Assistant:

bool R_ClipWallSegment (int first, int last, bool solid)
{
	cliprange_t *next, *start;
	int i, j;
	bool res = false;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		res = true;
		if (last <= start->first)
		{
			// Post is entirely visible (above start).
			R_StoreWallRange (first, last);
			if (fake3D & FAKE3D_FAKEMASK)
			{
				return true;
			}

			// Insert a new clippost for solid walls.
			if (solid)
			{
				if (last == start->first)
				{
					start->first = first;
				}
				else
				{
					next = newend;
					newend++;
					while (next != start)
					{
						*next = *(next-1);
						next--;
					}
					next->first = first;
					next->last = last;
				}
			}
			return true;
		}

		// There is a fragment above *start.
		R_StoreWallRange (first, start->first);

		// Adjust the clip size for solid walls
		if (solid && !(fake3D & FAKE3D_FAKEMASK))
		{
			start->first = first;
		}
	}

	// Bottom contained in start?
	if (last <= start->last)
		return res;

	next = start;
	while (last >= (next+1)->first)
	{
		// There is a fragment between two posts.
		R_StoreWallRange (next->last, (next+1)->first);
		next++;
		
		if (last <= next->last)
		{
			// Bottom is contained in next.
			last = next->last;
			goto crunch;
		}
	}

	// There is a fragment after *next.
	R_StoreWallRange (next->last, last);

crunch:
	if (fake3D & FAKE3D_FAKEMASK)
	{
		return true;
	}
	if (solid)
	{
		// Adjust the clip size.
		start->last = last;

		if (next != start)
		{
			// Remove start+1 to next from the clip list,
			// because start now covers their area.
			for (i = 1, j = (int)(newend - next); j > 0; i++, j--)
			{
				start[i] = next[i];
			}
			newend = start+i;
		}
	}
	return true;
}